

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_stream.cpp
# Opt level: O0

void __thiscall lambda_sum_Test::TestBody(lambda_sum_Test *this)

{
  Fold<int,_const_lambda::Curried<std::plus<void>_>_&> pipe;
  bool bVar1;
  int iVar2;
  AssertionResult gtest_ar;
  vector<int,_std::allocator<int>_> *range;
  Range<std::vector<int,_std::allocator<int>_>_> *arg;
  int *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff34;
  char *expected_expression;
  int line;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  Type in_stack_ffffffffffffff4c;
  AssertHelper *in_stack_ffffffffffffff50;
  int *in_stack_ffffffffffffff68;
  int *in_stack_ffffffffffffff70;
  int *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 uVar4;
  undefined4 uVar5;
  AssertHelper *in_stack_ffffffffffffffa0;
  int *in_stack_ffffffffffffffa8;
  AssertionResult local_18;
  
  uVar5 = 1;
  uVar4 = 2;
  arg = (Range<std::vector<int,_std::allocator<int>_>_> *)&stack0xffffffffffffff84;
  range = (vector<int,_std::allocator<int>_> *)&stack0xffffffffffffff88;
  expected_expression = &stack0xffffffffffffffa0;
  lambda::factory::vector<int,int,int,int,int,int,int>
            ((int *)0x600000007,(int *)CONCAT44(8,in_stack_ffffffffffffff80),
             in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
             (int *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffffa8);
  lambda::streams::stream<std::vector<int,_std::allocator<int>_>,_0>(range);
  pipe.f._0_4_ = in_stack_ffffffffffffff30;
  pipe._0_8_ = in_stack_ffffffffffffff28;
  pipe.f._4_4_ = in_stack_ffffffffffffff34;
  iVar2 = lambda::streams::
          operator|<lambda::streams::Range<std::vector<int,_std::allocator<int>_>_>,_lambda::streams::Fold<int,_const_lambda::Curried<std::plus<void>_>_&>,_0>
                    (arg,pipe);
  testing::internal::EqHelper<false>::Compare<int,int>
            (expected_expression,(char *)CONCAT44(iVar2,in_stack_ffffffffffffff30),
             in_stack_ffffffffffffff28,(int *)arg);
  line = (int)((ulong)expected_expression >> 0x20);
  lambda::streams::Range<std::vector<int,_std::allocator<int>_>_>::~Range
            ((Range<std::vector<int,_std::allocator<int>_>_> *)0x18953e);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)CONCAT44(iVar2,in_stack_ffffffffffffff30));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  uVar3 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff30);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff50);
    testing::AssertionResult::failure_message((AssertionResult *)0x1895d6);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
               (char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),line,
               (char *)CONCAT44(iVar2,uVar3));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffffa0,(Message *)CONCAT44(uVar5,uVar4));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)arg);
    testing::Message::~Message((Message *)0x189624);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x189677);
  return;
}

Assistant:

TEST(lambda, sum) { ASSERT_EQ(31, stream(vector(1, 2, 3, 4, 6, 7, 8)) | sum); }